

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void CombinationKeygenRecurse<Blob<128>,block64>
               (block64 *key,int len,int maxlen,block64 *blocks,int blockcount,pfHash hash,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  block64 *pbVar9;
  long lVar10;
  Blob<128> h;
  value_type local_48;
  
  if (0 < blockcount && len != maxlen) {
    pbVar9 = key + len;
    lVar10 = 0;
    do {
      pcVar1 = blocks->c + lVar10;
      uVar2 = *(undefined8 *)(pcVar1 + 8);
      uVar3 = *(undefined8 *)(pcVar1 + 0x10);
      uVar4 = *(undefined8 *)(pcVar1 + 0x18);
      uVar5 = *(undefined8 *)(pcVar1 + 0x20);
      uVar6 = *(undefined8 *)(pcVar1 + 0x28);
      uVar7 = *(undefined8 *)(pcVar1 + 0x30);
      uVar8 = *(undefined8 *)(pcVar1 + 0x38);
      *(undefined8 *)pbVar9->c = *(undefined8 *)pcVar1;
      *(undefined8 *)(pbVar9->c + 8) = uVar2;
      *(undefined8 *)(pbVar9->c + 0x10) = uVar3;
      *(undefined8 *)(pbVar9->c + 0x18) = uVar4;
      *(undefined8 *)(pbVar9->c + 0x20) = uVar5;
      *(undefined8 *)(pbVar9->c + 0x28) = uVar6;
      *(undefined8 *)(pbVar9->c + 0x30) = uVar7;
      *(undefined8 *)(pbVar9->c + 0x38) = uVar8;
      local_48.bytes[0] = '\0';
      local_48.bytes[1] = '\0';
      local_48.bytes[2] = '\0';
      local_48.bytes[3] = '\0';
      local_48.bytes[4] = '\0';
      local_48.bytes[5] = '\0';
      local_48.bytes[6] = '\0';
      local_48.bytes[7] = '\0';
      local_48.bytes[8] = '\0';
      local_48.bytes[9] = '\0';
      local_48.bytes[10] = '\0';
      local_48.bytes[0xb] = '\0';
      local_48.bytes[0xc] = '\0';
      local_48.bytes[0xd] = '\0';
      local_48.bytes[0xe] = '\0';
      local_48.bytes[0xf] = '\0';
      (*hash)(key,(len + 1) * 0x40,0,&local_48);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_48);
      CombinationKeygenRecurse<Blob<128>,block64>(key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      lVar10 = lVar10 + 0x40;
    } while ((ulong)(uint)blockcount << 6 != lVar10);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}